

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bar.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::BarFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *this;
  ScalarFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_3b9;
  ScalarFunctionSet *local_3b8;
  _Function_base local_3b0;
  code *local_398;
  _Function_base local_390;
  code *local_378;
  LogicalType local_370 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_358;
  LogicalType local_340 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_328;
  LogicalType local_310 [24];
  LogicalType local_2f8 [24];
  LogicalType local_2e0 [24];
  LogicalType local_2c8 [24];
  LogicalType local_2b0 [24];
  LogicalType local_298 [24];
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  local_3b8 = in_RDI;
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  duckdb::LogicalType::LogicalType(local_310,DOUBLE);
  duckdb::LogicalType::LogicalType(local_2f8,DOUBLE);
  duckdb::LogicalType::LogicalType(local_2e0,DOUBLE);
  duckdb::LogicalType::LogicalType(local_2c8,DOUBLE);
  __l._M_len = 4;
  __l._M_array = local_310;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_328,__l,&local_3b9);
  duckdb::LogicalType::LogicalType(local_340,VARCHAR);
  local_390._M_functor._8_8_ = 0;
  local_390._M_functor._M_unused._M_object = BarFunction;
  local_378 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_390._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  duckdb::LogicalType::LogicalType(local_298,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_158,&local_328,local_340,&local_390,0,0,0,0,local_298,0,0,0);
  this = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
         (local_3b8 + 0x20);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_158);
  ScalarFunction::~ScalarFunction(&local_158);
  duckdb::LogicalType::~LogicalType(local_298);
  std::_Function_base::~_Function_base(&local_390);
  duckdb::LogicalType::~LogicalType(local_340);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_328);
  lVar1 = 0x48;
  do {
    duckdb::LogicalType::~LogicalType(local_310 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  duckdb::LogicalType::LogicalType(local_310,DOUBLE);
  duckdb::LogicalType::LogicalType(local_2f8,DOUBLE);
  duckdb::LogicalType::LogicalType(local_2e0,DOUBLE);
  __l_00._M_len = 3;
  __l_00._M_array = local_310;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_358,__l_00,&local_3b9);
  duckdb::LogicalType::LogicalType(local_370,VARCHAR);
  local_3b0._M_functor._8_8_ = 0;
  local_3b0._M_functor._M_unused._M_object = BarFunction;
  local_398 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_3b0._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  duckdb::LogicalType::LogicalType(local_2b0,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_280,&local_358,local_370,&local_3b0,0,0,0,0,local_2b0,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_280);
  ScalarFunction::~ScalarFunction(&local_280);
  duckdb::LogicalType::~LogicalType(local_2b0);
  std::_Function_base::~_Function_base(&local_3b0);
  duckdb::LogicalType::~LogicalType(local_370);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_358);
  lVar1 = 0x30;
  do {
    duckdb::LogicalType::~LogicalType(local_310 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return local_3b8;
}

Assistant:

ScalarFunctionSet BarFun::GetFunctions() {
	ScalarFunctionSet bar;
	bar.AddFunction(ScalarFunction({LogicalType::DOUBLE, LogicalType::DOUBLE, LogicalType::DOUBLE, LogicalType::DOUBLE},
	                               LogicalType::VARCHAR, BarFunction));
	bar.AddFunction(ScalarFunction({LogicalType::DOUBLE, LogicalType::DOUBLE, LogicalType::DOUBLE},
	                               LogicalType::VARCHAR, BarFunction));
	return bar;
}